

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtableview.cpp
# Opt level: O3

void __thiscall QTableCornerButton::paintEvent(QTableCornerButton *this,QPaintEvent *param_1)

{
  QWidgetData *pQVar1;
  bool bVar2;
  QStyle *pQVar3;
  uint uVar4;
  uint uVar5;
  long in_FS_OFFSET;
  QPainter painter;
  undefined1 *local_b8;
  QStyleOptionHeader local_b0;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_b0,0xaa,0x88);
  QStyleOptionHeader::QStyleOptionHeader(&local_b0);
  QStyleOption::initFrom(&local_b0.super_QStyleOption,(QWidget *)this);
  uVar5 = ~((this->super_QAbstractButton).super_QWidget.data)->widget_attributes & 1;
  bVar2 = QWidget::isActiveWindow((QWidget *)this);
  uVar4 = uVar5 + 0x10000;
  if (!bVar2) {
    uVar4 = uVar5;
  }
  bVar2 = QAbstractButton::isDown(&this->super_QAbstractButton);
  local_b0.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
  super_QFlagsStorage<QStyle::StateFlag>.i =
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)
       (QFlagsStorageHelper<QStyle::StateFlag,_4>)(uVar4 + 4);
  if (!bVar2) {
    local_b0.super_QStyleOption.state.super_QFlagsStorageHelper<QStyle::StateFlag,_4>.
    super_QFlagsStorage<QStyle::StateFlag>.i =
         (QFlagsStorageHelper<QStyle::StateFlag,_4>)(QFlagsStorageHelper<QStyle::StateFlag,_4>)uVar4
    ;
  }
  pQVar1 = (this->super_QAbstractButton).super_QWidget.data;
  local_b0.super_QStyleOption.rect.x2.m_i = (pQVar1->crect).x2.m_i - (pQVar1->crect).x1.m_i;
  local_b0.super_QStyleOption.rect.y2.m_i = (pQVar1->crect).y2.m_i - (pQVar1->crect).y1.m_i;
  local_b0.super_QStyleOption.rect.x1.m_i = 0;
  local_b0.super_QStyleOption.rect.y1.m_i = 0;
  local_b0.position = OnlyOneSection;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_b8,
                     &(this->super_QAbstractButton).super_QWidget.super_QPaintDevice);
  pQVar3 = QWidget::style((QWidget *)this);
  (**(code **)(*(long *)pQVar3 + 0xb8))(pQVar3,0x17,&local_b0,&local_b8,this);
  QPainter::~QPainter((QPainter *)&local_b8);
  QIcon::~QIcon(&local_b0.icon);
  if (&(local_b0.text.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_b0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_b0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_b0.text.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_b0.text.d.d)->super_QArrayData,2,0x10);
    }
  }
  QStyleOption::~QStyleOption(&local_b0.super_QStyleOption);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void paintEvent(QPaintEvent*) override {
        QStyleOptionHeader opt;
        opt.initFrom(this);
        QStyle::State state = QStyle::State_None;
        if (isEnabled())
            state |= QStyle::State_Enabled;
        if (isActiveWindow())
            state |= QStyle::State_Active;
        if (isDown())
            state |= QStyle::State_Sunken;
        opt.state = state;
        opt.rect = rect();
        opt.position = QStyleOptionHeader::OnlyOneSection;
        QPainter painter(this);
        style()->drawControl(QStyle::CE_Header, &opt, &painter, this);
    }